

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_match.c
# Opt level: O0

wchar_t archive_match_exclude_pattern_w(archive *_a,wchar_t *pattern)

{
  int iVar1;
  wchar_t *in_RSI;
  archive *in_RDI;
  wchar_t magic_test;
  wchar_t r;
  archive_match *a;
  char *in_stack_00000078;
  uint in_stack_00000080;
  uint in_stack_00000084;
  archive *in_stack_00000088;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  wchar_t wVar2;
  
  iVar1 = __archive_check_magic
                    (in_stack_00000088,in_stack_00000084,in_stack_00000080,in_stack_00000078);
  if (iVar1 == -0x1e) {
    wVar2 = L'\xffffffe2';
  }
  else if ((in_RSI == (wchar_t *)0x0) || (*in_RSI == L'\0')) {
    archive_set_error(in_RDI,0x16,"pattern is empty");
    wVar2 = L'\xffffffe7';
  }
  else {
    wVar2 = add_pattern_wcs((archive_match *)
                            CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                            (match_list *)in_RDI,in_RSI);
    if (wVar2 == L'\0') {
      wVar2 = L'\0';
    }
  }
  return wVar2;
}

Assistant:

int
archive_match_exclude_pattern_w(struct archive *_a, const wchar_t *pattern)
{
	struct archive_match *a;
	int r;

	archive_check_magic(_a, ARCHIVE_MATCH_MAGIC,
	    ARCHIVE_STATE_NEW, "archive_match_exclude_pattern_w");
	a = (struct archive_match *)_a;

	if (pattern == NULL || *pattern == L'\0') {
		archive_set_error(&(a->archive), EINVAL, "pattern is empty");
		return (ARCHIVE_FAILED);
	}
	if ((r = add_pattern_wcs(a, &(a->exclusions), pattern)) != ARCHIVE_OK)
		return (r);
	return (ARCHIVE_OK);
}